

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O1

void __thiscall SuiteMessageTests::TestoutOfOrder::RunImpl(TestoutOfOrder *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestResults *results;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  Message object;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  TestDetails local_188;
  Message local_168 [344];
  
  FIX::Message::Message(local_168);
  paVar1 = &local_1a8.field_2;
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,
             "54=1\x0120=0\x0131=109.03125\x0160=00000000-00:00:00\x018=FIX.4.2\x016=109.03125\x011=acct1\x01151=0\x01150=2\x0117=2\x0139=2\x0138=3000\x0149=MEK\x0115=USD\x0137=1\x0148=123ABC789\x0114=3000\x0135=8\x0156=KEM\x0134=2\x0155=ABCD\x0111=ID1\x0122=1\x01"
             ,"");
  FIX::Message::setString
            ((string *)local_168,SUB81(&local_1a8,0),(DataDictionary *)0x0,(DataDictionary *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  ppTVar2 = UnitTest::CurrentTest::Results();
  results = *ppTVar2;
  FIX::Message::toString_abi_cxx11_((int)&local_1a8,(int)local_168,8);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_188,*ppTVar3,0x1a2);
  UnitTest::CheckEqual<char_const*,std::__cxx11::string>
            (results,&RunImpl::expected,&local_1a8,&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  FIX::Message::~Message(local_168);
  return;
}

Assistant:

TEST(outOfOrder)
{
  FIX::Message object;
  static const char * str =
    "54=1\00120=0\00131=109.03125\00160=00000000-00:00:00\001"
    "8=FIX.4.2\0016=109.03125\0011=acct1\001151=0\001150=2\001"
    "17=2\00139=2\00138=3000\00149=MEK\00115=USD\00137=1\001"
    "48=123ABC789\00114=3000\00135=8\00156=KEM\00134=2\001"
    "55=ABCD\00111=ID1\00122=1\001";

  static const char * expected =
    "8=FIX.4.2\0019=171\00135=8\00134=2\00149=MEK\00156=KEM\0011=acct1\001"
    "6=109.03125\00111=ID1\00114=3000\00115=USD\00117=2\00120=0\00122=1\001"
    "31=109.03125\00137=1\00138=3000\00139=2\00148=123ABC789\001"
    "54=1\00155=ABCD\00160=00000000-00:00:00\001150=2\001151=0\00110=225\001";

  object.setString( str, false );
  CHECK_EQUAL( expected, object.toString() );
}